

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

MCU * readMCU(MCU *__return_storage_ptr__,FILE *f)

{
  uchar number;
  int j;
  int iVar1;
  int iVar2;
  acCode aVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  int w;
  ulong uVar8;
  int i;
  ulong uVar9;
  bool bVar10;
  
  memset(__return_storage_ptr__,0,0x2000);
  uVar9 = 1;
  do {
    if (uVar9 == 4) {
      return __return_storage_ptr__;
    }
    number = (uchar)(uVar9 >> 1);
    for (uVar6 = 0; uVar6 < subVector[uVar9].height; uVar6 = uVar6 + 1) {
      for (uVar8 = 0; uVar8 < subVector[uVar9].width; uVar8 = uVar8 + 1) {
        iVar1 = readDC(f,number);
        iVar2 = readMCU::dc[uVar9];
        readMCU::dc[uVar9] = iVar1 + iVar2;
        __return_storage_ptr__->mcu[uVar9][uVar6][uVar8][0][0] = (double)(iVar1 + iVar2);
        uVar7 = 1;
        while (uVar5 = (uint)uVar7, uVar5 < 0x40) {
          aVar3 = readAC(f,number);
          uVar4 = (uint)aVar3.zeros;
          if (uVar4 == 0x10 && aVar3.len == '\0') {
            for (iVar2 = 0; uVar4 = uVar5 + iVar2, iVar2 != 0x10; iVar2 = iVar2 + 1) {
              __return_storage_ptr__->mcu[uVar9][uVar6][uVar8][uVar4 >> 3][uVar4 & 7] = 0.0;
            }
            uVar7 = (ulong)uVar4;
          }
          else {
            if (aVar3.len == '\0') break;
            uVar5 = aVar3.zeros + uVar5;
            while (bVar10 = uVar4 != 0, uVar4 = uVar4 - 1, bVar10) {
              __return_storage_ptr__->mcu[uVar9][uVar6][uVar8][uVar7 >> 3][(uint)uVar7 & 7] = 0.0;
              uVar7 = (ulong)((uint)uVar7 + 1);
            }
            __return_storage_ptr__->mcu[uVar9][uVar6][uVar8][uVar5 >> 3][uVar5 & 7] =
                 (double)aVar3.value;
            uVar7 = (ulong)(uVar5 + 1);
          }
        }
        while (uVar5 = (uint)uVar7, uVar5 < 0x40) {
          __return_storage_ptr__->mcu[uVar9][uVar6][uVar8][uVar7 >> 3][uVar5 & 7] = 0.0;
          uVar7 = (ulong)(uVar5 + 1);
        }
      }
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

MCU readMCU(FILE *f) {
    static int dc[4] = {0, 0, 0, 0};
    auto mcu = MCU();
    for (int i = 1; i <= 3; i++) {
        for (int h = 0; h < subVector[i].height; h++) {
            for (int w = 0; w < subVector[i].width; w++) {
                dc[i] = readDC(f, i/2) + dc[i];
                mcu.mcu[i][h][w][0][0] = dc[i];
                unsigned int count = 1;
                while (count < 64) {
                    acCode ac = readAC(f, i/2);
                    if (ac.len == 0 && ac.zeros == 16) {
                        for (int j = 0; j < ac.zeros; j++) {
                            mcu.mcu[i][h][w][count/8][count%8] = 0;
                            count++;
                        }
                    } else if (ac.len == 0) {
                        break;
                    } else {
                        for (int j = 0; j < ac.zeros; j++) {
                            mcu.mcu[i][h][w][count/8][count%8] = 0;
                            count++;
                        }
                        mcu.mcu[i][h][w][count/8][count%8] = ac.value;
                        count++;
                    }
                }
                while (count < 64) {
                    mcu.mcu[i][h][w][count/8][count%8] = 0;
                    count++;
                }
            }
        }
    }
    return mcu;
}